

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_LE_Test::
~iu_GTestSyntaxTest_x_iutest_x_LE_Test(iu_GTestSyntaxTest_x_iutest_x_LE_Test *this)

{
  iu_GTestSyntaxTest_x_iutest_x_LE_Test *this_local;
  
  ~iu_GTestSyntaxTest_x_iutest_x_LE_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST(GTestSyntaxTest, LE)
{
    if( int x = 1 )
        ASSERT_LE(1, x) << x;
    if( int x = 1 )
        EXPECT_LE(1, x) << x;
    if( int x = 1 )
        INFORM_LE(1, x) << x;
    if( int x = 1 )
        ASSUME_LE(1, x) << x;
}